

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_ENCRYPTED_SECRET_Unmarshal
                 (TPMU_ENCRYPTED_SECRET *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_ENCRYPTED_SECRET *target_local;
  
  switch(selector) {
  case 1:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->ecc,buffer,size,0x100);
    break;
  default:
    target_local._4_4_ = 0x98;
    break;
  case 8:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->ecc,buffer,size,0x42);
    break;
  case 0x23:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->ecc,buffer,size,0x44);
    break;
  case 0x25:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->ecc,buffer,size,0x42);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_ENCRYPTED_SECRET_Unmarshal(TPMU_ENCRYPTED_SECRET *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_ECC
        case TPM_ALG_ECC:
            return BYTE_Array_Unmarshal((BYTE *)(target->ecc), buffer, size, (INT32)sizeof(TPMS_ECC_POINT));
#endif // ALG_ECC
#if         ALG_RSA
        case TPM_ALG_RSA:
            return BYTE_Array_Unmarshal((BYTE *)(target->rsa), buffer, size, (INT32)MAX_RSA_KEY_BYTES);
#endif // ALG_RSA
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return BYTE_Array_Unmarshal((BYTE *)(target->symmetric), buffer, size, (INT32)sizeof(TPM2B_DIGEST));
#endif // ALG_SYMCIPHER
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return BYTE_Array_Unmarshal((BYTE *)(target->keyedHash), buffer, size, (INT32)sizeof(TPM2B_DIGEST));
#endif // ALG_KEYEDHASH
    }
    return TPM_RC_SELECTOR;
}